

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cTextureStorageMultisampleTests.cpp
# Opt level: O1

int __thiscall
glcts::TextureStorageMultisampleTests::init(TextureStorageMultisampleTests *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  TestNode *pTVar1;
  TestNode *node;
  TestNode *node_00;
  TestNode *node_01;
  TestNode *node_02;
  TestNode *node_03;
  TestNode *node_04;
  TestNode *node_05;
  TestNode *node_06;
  MultisampleTextureGetActiveUniformSamplersTest *this_00;
  MultisampleTextureTexStorage2DGeneralSamplesNumberTest *this_01;
  MultisampleTextureTexStorage2DInvalidAndBorderCaseTextureSizesTest *this_02;
  MultisampleTextureTexStorage2DNonColorDepthOrStencilInternalFormatsTest *this_03;
  MultisampleTextureTexStorage2DReconfigurationRejectedTest *this_04;
  MultisampleTextureTexStorage2DUnsupportedSamplesCountForColorTexturesTest *this_05;
  MultisampleTextureTexStorage2DUnsupportedSamplesCountForDepthTexturesTest *this_06;
  MultisampleTextureTexStorage2DUnsupportedSamplesCountForDepthStencilTexturesTest *this_07;
  MultisampleTextureTexStorage2DValidCallsTest *this_08;
  MultisampleTextureTexStorage2DZeroSampleTest *this_09;
  InvalidTextureSizesAreRejectedValidAreAcceptedTest *this_10;
  MultisampleTextureTexStorage3DZeroSampleTest *this_11;
  NonColorDepthStencilRenderableInternalformatsAreRejectedTest *this_12;
  RequestsToSetUpMultisampleColorTexturesWithUnsupportedNumberOfSamplesAreRejectedTest *this_13;
  RequestsToSetUpMultisampleDepthTexturesWithUnsupportedNumberOfSamplesAreRejectedTest *this_14;
  RequestsToSetUpMultisampleStencilTexturesWithUnsupportedNumberOfSamplesAreRejectedTest *this_15;
  RequestsToSetUpMultisampleTexturesWithValidAndInvalidNumberOfSamplesTest *this_16;
  Texture2DMultisampleTargetIsRejectedTest *this_17;
  ValidInternalformatAndSamplesValuesAreAcceptedTest *this_18;
  MultisampleTextureGetMultisamplefvNullValArgumentsAcceptedTest *this_19;
  MultisampleTextureGetTexLevelParametervFunctionalTest *this_20;
  MultisampleTextureGetTexLevelParametervInvalidTextureTargetRejectedTest *this_21;
  MultisampleTextureGetTexLevelParametervInvalidValueArgumentRejectedTest *this_22;
  MultisampleTextureGetTexLevelParametervNegativeLodIsRejectedTest *this_23;
  MultisampleTextureGetTexLevelParametervWorksForMaximumLodTest *this_24;
  MultisampleTextureDependenciesFBOIncompleteness1Test *this_25;
  MultisampleTextureDependenciesFBOIncompleteness2Test *this_26;
  MultisampleTextureDependenciesFBOIncompleteness3Test *this_27;
  MultisampleTextureDependenciesFBOIncompleteness4Test *this_28;
  MultisampleTextureDependenciesFBOIncompleteness5Test *this_29;
  MultisampleTextureDependenciesInvalidFramebufferTexture2DCalls1Test *this_30;
  MultisampleTextureDependenciesInvalidFramebufferTexture2DCalls2Test *this_31;
  MultisampleTextureDependenciesInvalidFramebufferTextureLayerCalls1Test *this_32;
  MultisampleTextureDependenciesInvalidFramebufferTextureLayerCalls2Test *this_33;
  MultisampleTextureDependenciesInvalidRenderbufferStorageMultisampleCalls1Test *this_34;
  MultisampleTextureDependenciesInvalidRenderbufferStorageMultisampleCalls2Test *this_35;
  MultisampleTextureDependenciesNoErrorGeneratedForValidFramebufferTexture2DCallsTest *this_36;
  MultisampleTextureDependenciesNoErrorGeneratedForValidRenderbufferStorageMultisampleCallsTest
  *this_37;
  MultisampleTextureDependenciesTexParameterTest *this_38;
  GLCoverageExtensionSpecificEnumsAreRecognizedTest *this_39;
  GLCoverageGLGetTexParameterReportsCorrectDefaultValuesForMultisampleTextureTargets *this_40;
  GLCoverageGLTexParameterHandlersAcceptZeroBaseLevelForExtensionSpecificTextureTargetsTest *this_41
  ;
  MultisampleTextureFunctionalTestsBlittingTest *this_42;
  MultisampleTextureFunctionalTestsBlittingMultisampledDepthAttachmentTest *this_43;
  MultisampleTextureFunctionalTestsBlittingMultisampledIntegerAttachmentTest *this_44;
  MultisampleTextureFunctionalTestsBlittingToMultisampledFBOIsForbiddenTest *this_45;
  MultisampleTextureFunctionalTestsSampleMaskingForNonIntegerColorRenderableTexturesTest *this_46;
  MultisampleTextureFunctionalTestsTextureSizeFragmentShadersTest *this_47;
  MultisampleTextureFunctionalTestsTextureSizeVertexShadersTest *this_48;
  
  pTVar1 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar1,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "APIGLGetActiveUniform","glGetActiveUniform()");
  node = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)node,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "APIGLTexStorage2DMultisample","glTexStorage2DMultisample()");
  node_00 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)node_00,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "APIGLTexStorage3DMultisample","glTexStorage3DMultisampleOES()");
  node_01 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)node_01,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "APIGLGetMultisamplefv","glGetMultisamplefv()");
  node_02 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)node_02,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "APIGLGetTexLevelParameterifv","glGetTexLevelParameterifv()");
  node_03 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)node_03,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "APIGLSampleMaski","glSampleMaski()");
  node_04 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)node_04,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "APIDependencies","API Dependncies");
  node_05 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)node_05,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"GLCoverage",
             "GL Coverage");
  node_06 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)node_06,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "FunctionalTests","Functional Tests");
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  tcu::TestNode::addChild((TestNode *)this,node);
  tcu::TestNode::addChild((TestNode *)this,node_00);
  tcu::TestNode::addChild((TestNode *)this,node_01);
  tcu::TestNode::addChild((TestNode *)this,node_02);
  tcu::TestNode::addChild((TestNode *)this,node_03);
  tcu::TestNode::addChild((TestNode *)this,node_04);
  tcu::TestNode::addChild((TestNode *)this,node_05);
  tcu::TestNode::addChild((TestNode *)this,node_06);
  this_00 = (MultisampleTextureGetActiveUniformSamplersTest *)operator_new(0x88);
  MultisampleTextureGetActiveUniformSamplersTest::MultisampleTextureGetActiveUniformSamplersTest
            (this_00,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild(pTVar1,(TestNode *)this_00);
  this_01 = (MultisampleTextureTexStorage2DGeneralSamplesNumberTest *)operator_new(0x80);
  MultisampleTextureTexStorage2DGeneralSamplesNumberTest::
  MultisampleTextureTexStorage2DGeneralSamplesNumberTest
            (this_01,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild(node,(TestNode *)this_01);
  this_02 = (MultisampleTextureTexStorage2DInvalidAndBorderCaseTextureSizesTest *)operator_new(0x80)
  ;
  MultisampleTextureTexStorage2DInvalidAndBorderCaseTextureSizesTest::
  MultisampleTextureTexStorage2DInvalidAndBorderCaseTextureSizesTest
            (this_02,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild(node,(TestNode *)this_02);
  this_03 = (MultisampleTextureTexStorage2DNonColorDepthOrStencilInternalFormatsTest *)
            operator_new(0x80);
  MultisampleTextureTexStorage2DNonColorDepthOrStencilInternalFormatsTest::
  MultisampleTextureTexStorage2DNonColorDepthOrStencilInternalFormatsTest
            (this_03,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild(node,(TestNode *)this_03);
  this_04 = (MultisampleTextureTexStorage2DReconfigurationRejectedTest *)operator_new(0x88);
  MultisampleTextureTexStorage2DReconfigurationRejectedTest::
  MultisampleTextureTexStorage2DReconfigurationRejectedTest
            (this_04,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild(node,(TestNode *)this_04);
  pTVar1 = (TestNode *)operator_new(0x78);
  MultisampleTextureTexStorage2DTexture2DMultisampleArrayTest::
  MultisampleTextureTexStorage2DTexture2DMultisampleArrayTest
            ((MultisampleTextureTexStorage2DTexture2DMultisampleArrayTest *)pTVar1,
             (this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild(node,pTVar1);
  this_05 = (MultisampleTextureTexStorage2DUnsupportedSamplesCountForColorTexturesTest *)
            operator_new(0x80);
  MultisampleTextureTexStorage2DUnsupportedSamplesCountForColorTexturesTest::
  MultisampleTextureTexStorage2DUnsupportedSamplesCountForColorTexturesTest
            (this_05,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild(node,(TestNode *)this_05);
  this_06 = (MultisampleTextureTexStorage2DUnsupportedSamplesCountForDepthTexturesTest *)
            operator_new(0x80);
  MultisampleTextureTexStorage2DUnsupportedSamplesCountForDepthTexturesTest::
  MultisampleTextureTexStorage2DUnsupportedSamplesCountForDepthTexturesTest
            (this_06,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild(node,(TestNode *)this_06);
  this_07 = (MultisampleTextureTexStorage2DUnsupportedSamplesCountForDepthStencilTexturesTest *)
            operator_new(0x80);
  MultisampleTextureTexStorage2DUnsupportedSamplesCountForDepthStencilTexturesTest::
  MultisampleTextureTexStorage2DUnsupportedSamplesCountForDepthStencilTexturesTest
            (this_07,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild(node,(TestNode *)this_07);
  this_08 = (MultisampleTextureTexStorage2DValidCallsTest *)operator_new(0x80);
  MultisampleTextureTexStorage2DValidCallsTest::MultisampleTextureTexStorage2DValidCallsTest
            (this_08,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild(node,(TestNode *)this_08);
  this_09 = (MultisampleTextureTexStorage2DZeroSampleTest *)operator_new(0x80);
  MultisampleTextureTexStorage2DZeroSampleTest::MultisampleTextureTexStorage2DZeroSampleTest
            (this_09,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild(node,(TestNode *)this_09);
  this_10 = (InvalidTextureSizesAreRejectedValidAreAcceptedTest *)operator_new(0x90);
  InvalidTextureSizesAreRejectedValidAreAcceptedTest::
  InvalidTextureSizesAreRejectedValidAreAcceptedTest(this_10,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild(node_00,(TestNode *)this_10);
  this_11 = (MultisampleTextureTexStorage3DZeroSampleTest *)operator_new(0x80);
  MultisampleTextureTexStorage3DZeroSampleTest::MultisampleTextureTexStorage3DZeroSampleTest
            (this_11,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild(node_00,(TestNode *)this_11);
  this_12 = (NonColorDepthStencilRenderableInternalformatsAreRejectedTest *)operator_new(0x80);
  NonColorDepthStencilRenderableInternalformatsAreRejectedTest::
  NonColorDepthStencilRenderableInternalformatsAreRejectedTest
            (this_12,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild(node_00,(TestNode *)this_12);
  this_13 = (RequestsToSetUpMultisampleColorTexturesWithUnsupportedNumberOfSamplesAreRejectedTest *)
            operator_new(0x80);
  RequestsToSetUpMultisampleColorTexturesWithUnsupportedNumberOfSamplesAreRejectedTest::
  RequestsToSetUpMultisampleColorTexturesWithUnsupportedNumberOfSamplesAreRejectedTest
            (this_13,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild(node_00,(TestNode *)this_13);
  this_14 = (RequestsToSetUpMultisampleDepthTexturesWithUnsupportedNumberOfSamplesAreRejectedTest *)
            operator_new(0x80);
  RequestsToSetUpMultisampleDepthTexturesWithUnsupportedNumberOfSamplesAreRejectedTest::
  RequestsToSetUpMultisampleDepthTexturesWithUnsupportedNumberOfSamplesAreRejectedTest
            (this_14,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild(node_00,(TestNode *)this_14);
  this_15 = (RequestsToSetUpMultisampleStencilTexturesWithUnsupportedNumberOfSamplesAreRejectedTest
             *)operator_new(0x80);
  RequestsToSetUpMultisampleStencilTexturesWithUnsupportedNumberOfSamplesAreRejectedTest::
  RequestsToSetUpMultisampleStencilTexturesWithUnsupportedNumberOfSamplesAreRejectedTest
            (this_15,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild(node_00,(TestNode *)this_15);
  this_16 = (RequestsToSetUpMultisampleTexturesWithValidAndInvalidNumberOfSamplesTest *)
            operator_new(0x80);
  RequestsToSetUpMultisampleTexturesWithValidAndInvalidNumberOfSamplesTest::
  RequestsToSetUpMultisampleTexturesWithValidAndInvalidNumberOfSamplesTest
            (this_16,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild(node_00,(TestNode *)this_16);
  this_17 = (Texture2DMultisampleTargetIsRejectedTest *)operator_new(0x80);
  Texture2DMultisampleTargetIsRejectedTest::Texture2DMultisampleTargetIsRejectedTest
            (this_17,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild(node_00,(TestNode *)this_17);
  this_18 = (ValidInternalformatAndSamplesValuesAreAcceptedTest *)operator_new(0x80);
  ValidInternalformatAndSamplesValuesAreAcceptedTest::
  ValidInternalformatAndSamplesValuesAreAcceptedTest(this_18,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild(node_00,(TestNode *)this_18);
  pTVar1 = (TestNode *)operator_new(0x78);
  MultisampleTextureGetMultisamplefvIndexEqualGLSamplesRejectedTest::
  MultisampleTextureGetMultisamplefvIndexEqualGLSamplesRejectedTest
            ((MultisampleTextureGetMultisamplefvIndexEqualGLSamplesRejectedTest *)pTVar1,
             (this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild(node_01,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  MultisampleTextureGetMultisamplefvIndexGreaterGLSamplesRejectedTest::
  MultisampleTextureGetMultisamplefvIndexGreaterGLSamplesRejectedTest
            ((MultisampleTextureGetMultisamplefvIndexGreaterGLSamplesRejectedTest *)pTVar1,
             (this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild(node_01,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  MultisampleTextureGetMultisamplefvInvalidPnameRejectedTest::
  MultisampleTextureGetMultisamplefvInvalidPnameRejectedTest
            ((MultisampleTextureGetMultisamplefvInvalidPnameRejectedTest *)pTVar1,
             (this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild(node_01,pTVar1);
  this_19 = (MultisampleTextureGetMultisamplefvNullValArgumentsAcceptedTest *)operator_new(0x80);
  MultisampleTextureGetMultisamplefvNullValArgumentsAcceptedTest::
  MultisampleTextureGetMultisamplefvNullValArgumentsAcceptedTest
            (this_19,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild(node_01,(TestNode *)this_19);
  pTVar1 = (TestNode *)operator_new(0x78);
  MultisampleTextureGetMultisamplefvSamplePositionValuesValidationTest::
  MultisampleTextureGetMultisamplefvSamplePositionValuesValidationTest
            ((MultisampleTextureGetMultisamplefvSamplePositionValuesValidationTest *)pTVar1,
             (this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild(node_01,pTVar1);
  this_20 = (MultisampleTextureGetTexLevelParametervFunctionalTest *)operator_new(0x98);
  MultisampleTextureGetTexLevelParametervFunctionalTest::
  MultisampleTextureGetTexLevelParametervFunctionalTest
            (this_20,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild(node_02,(TestNode *)this_20);
  this_21 = (MultisampleTextureGetTexLevelParametervInvalidTextureTargetRejectedTest *)
            operator_new(0x80);
  MultisampleTextureGetTexLevelParametervInvalidTextureTargetRejectedTest::
  MultisampleTextureGetTexLevelParametervInvalidTextureTargetRejectedTest
            (this_21,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild(node_02,(TestNode *)this_21);
  this_22 = (MultisampleTextureGetTexLevelParametervInvalidValueArgumentRejectedTest *)
            operator_new(0x80);
  MultisampleTextureGetTexLevelParametervInvalidValueArgumentRejectedTest::
  MultisampleTextureGetTexLevelParametervInvalidValueArgumentRejectedTest
            (this_22,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild(node_02,(TestNode *)this_22);
  this_23 = (MultisampleTextureGetTexLevelParametervNegativeLodIsRejectedTest *)operator_new(0x88);
  MultisampleTextureGetTexLevelParametervNegativeLodIsRejectedTest::
  MultisampleTextureGetTexLevelParametervNegativeLodIsRejectedTest
            (this_23,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild(node_02,(TestNode *)this_23);
  this_24 = (MultisampleTextureGetTexLevelParametervWorksForMaximumLodTest *)operator_new(0x80);
  MultisampleTextureGetTexLevelParametervWorksForMaximumLodTest::
  MultisampleTextureGetTexLevelParametervWorksForMaximumLodTest
            (this_24,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild(node_02,(TestNode *)this_24);
  pTVar1 = (TestNode *)operator_new(0x78);
  MultisampleTextureSampleMaskiGettersTest::MultisampleTextureSampleMaskiGettersTest
            ((MultisampleTextureSampleMaskiGettersTest *)pTVar1,
             (this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild(node_01,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  MultisampleTextureSampleMaskiIndexLowerThanGLMaxSampleMaskWordsTest::
  MultisampleTextureSampleMaskiIndexLowerThanGLMaxSampleMaskWordsTest
            ((MultisampleTextureSampleMaskiIndexLowerThanGLMaxSampleMaskWordsTest *)pTVar1,
             (this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild(node_01,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  MultisampleTextureSampleMaskiIndexEqualToGLMaxSampleMaskWordsTest::
  MultisampleTextureSampleMaskiIndexEqualToGLMaxSampleMaskWordsTest
            ((MultisampleTextureSampleMaskiIndexEqualToGLMaxSampleMaskWordsTest *)pTVar1,
             (this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild(node_01,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  MultisampleTextureSampleMaskiIndexGreaterGLMaxSampleMaskWordsTest::
  MultisampleTextureSampleMaskiIndexGreaterGLMaxSampleMaskWordsTest
            ((MultisampleTextureSampleMaskiIndexGreaterGLMaxSampleMaskWordsTest *)pTVar1,
             (this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild(node_01,pTVar1);
  this_25 = (MultisampleTextureDependenciesFBOIncompleteness1Test *)operator_new(0x88);
  MultisampleTextureDependenciesFBOIncompleteness1Test::
  MultisampleTextureDependenciesFBOIncompleteness1Test
            (this_25,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild(node_04,(TestNode *)this_25);
  this_26 = (MultisampleTextureDependenciesFBOIncompleteness2Test *)operator_new(0x88);
  MultisampleTextureDependenciesFBOIncompleteness2Test::
  MultisampleTextureDependenciesFBOIncompleteness2Test
            (this_26,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild(node_04,(TestNode *)this_26);
  this_27 = (MultisampleTextureDependenciesFBOIncompleteness3Test *)operator_new(0x90);
  MultisampleTextureDependenciesFBOIncompleteness3Test::
  MultisampleTextureDependenciesFBOIncompleteness3Test
            (this_27,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild(node_04,(TestNode *)this_27);
  this_28 = (MultisampleTextureDependenciesFBOIncompleteness4Test *)operator_new(0x88);
  MultisampleTextureDependenciesFBOIncompleteness4Test::
  MultisampleTextureDependenciesFBOIncompleteness4Test
            (this_28,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild(node_04,(TestNode *)this_28);
  this_29 = (MultisampleTextureDependenciesFBOIncompleteness5Test *)operator_new(0x88);
  MultisampleTextureDependenciesFBOIncompleteness5Test::
  MultisampleTextureDependenciesFBOIncompleteness5Test
            (this_29,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild(node_04,(TestNode *)this_29);
  this_30 = (MultisampleTextureDependenciesInvalidFramebufferTexture2DCalls1Test *)
            operator_new(0x80);
  MultisampleTextureDependenciesInvalidFramebufferTexture2DCalls1Test::
  MultisampleTextureDependenciesInvalidFramebufferTexture2DCalls1Test
            (this_30,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild(node_04,(TestNode *)this_30);
  this_31 = (MultisampleTextureDependenciesInvalidFramebufferTexture2DCalls2Test *)
            operator_new(0x80);
  MultisampleTextureDependenciesInvalidFramebufferTexture2DCalls2Test::
  MultisampleTextureDependenciesInvalidFramebufferTexture2DCalls2Test
            (this_31,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild(node_04,(TestNode *)this_31);
  this_32 = (MultisampleTextureDependenciesInvalidFramebufferTextureLayerCalls1Test *)
            operator_new(0x80);
  MultisampleTextureDependenciesInvalidFramebufferTextureLayerCalls1Test::
  MultisampleTextureDependenciesInvalidFramebufferTextureLayerCalls1Test
            (this_32,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild(node_04,(TestNode *)this_32);
  this_33 = (MultisampleTextureDependenciesInvalidFramebufferTextureLayerCalls2Test *)
            operator_new(0x80);
  MultisampleTextureDependenciesInvalidFramebufferTextureLayerCalls2Test::
  MultisampleTextureDependenciesInvalidFramebufferTextureLayerCalls2Test
            (this_33,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild(node_04,(TestNode *)this_33);
  this_34 = (MultisampleTextureDependenciesInvalidRenderbufferStorageMultisampleCalls1Test *)
            operator_new(0x80);
  MultisampleTextureDependenciesInvalidRenderbufferStorageMultisampleCalls1Test::
  MultisampleTextureDependenciesInvalidRenderbufferStorageMultisampleCalls1Test
            (this_34,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild(node_04,(TestNode *)this_34);
  this_35 = (MultisampleTextureDependenciesInvalidRenderbufferStorageMultisampleCalls2Test *)
            operator_new(0x80);
  MultisampleTextureDependenciesInvalidRenderbufferStorageMultisampleCalls2Test::
  MultisampleTextureDependenciesInvalidRenderbufferStorageMultisampleCalls2Test
            (this_35,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild(node_04,(TestNode *)this_35);
  this_36 = (MultisampleTextureDependenciesNoErrorGeneratedForValidFramebufferTexture2DCallsTest *)
            operator_new(0x80);
  MultisampleTextureDependenciesNoErrorGeneratedForValidFramebufferTexture2DCallsTest::
  MultisampleTextureDependenciesNoErrorGeneratedForValidFramebufferTexture2DCallsTest
            (this_36,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild(node_04,(TestNode *)this_36);
  this_37 = (MultisampleTextureDependenciesNoErrorGeneratedForValidRenderbufferStorageMultisampleCallsTest
             *)operator_new(0x80);
  MultisampleTextureDependenciesNoErrorGeneratedForValidRenderbufferStorageMultisampleCallsTest::
  MultisampleTextureDependenciesNoErrorGeneratedForValidRenderbufferStorageMultisampleCallsTest
            (this_37,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild(node_04,(TestNode *)this_37);
  this_38 = (MultisampleTextureDependenciesTexParameterTest *)operator_new(0x80);
  MultisampleTextureDependenciesTexParameterTest::MultisampleTextureDependenciesTexParameterTest
            (this_38,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild(node_04,(TestNode *)this_38);
  this_39 = (GLCoverageExtensionSpecificEnumsAreRecognizedTest *)operator_new(0x88);
  GLCoverageExtensionSpecificEnumsAreRecognizedTest::
  GLCoverageExtensionSpecificEnumsAreRecognizedTest(this_39,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild(node_05,(TestNode *)this_39);
  this_40 = (GLCoverageGLGetTexParameterReportsCorrectDefaultValuesForMultisampleTextureTargets *)
            operator_new(0x88);
  GLCoverageGLGetTexParameterReportsCorrectDefaultValuesForMultisampleTextureTargets::
  GLCoverageGLGetTexParameterReportsCorrectDefaultValuesForMultisampleTextureTargets
            (this_40,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild(node_05,(TestNode *)this_40);
  pTVar1 = (TestNode *)operator_new(0x78);
  GLCoverageGLSampleMaskModeStatusIsReportedCorrectlyTest::
  GLCoverageGLSampleMaskModeStatusIsReportedCorrectlyTest
            ((GLCoverageGLSampleMaskModeStatusIsReportedCorrectlyTest *)pTVar1,
             (this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild(node_05,pTVar1);
  this_41 = (GLCoverageGLTexParameterHandlersAcceptZeroBaseLevelForExtensionSpecificTextureTargetsTest
             *)operator_new(0x88);
  GLCoverageGLTexParameterHandlersAcceptZeroBaseLevelForExtensionSpecificTextureTargetsTest::
  GLCoverageGLTexParameterHandlersAcceptZeroBaseLevelForExtensionSpecificTextureTargetsTest
            (this_41,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild(node_05,(TestNode *)this_41);
  this_42 = (MultisampleTextureFunctionalTestsBlittingTest *)operator_new(0x90);
  MultisampleTextureFunctionalTestsBlittingTest::MultisampleTextureFunctionalTestsBlittingTest
            (this_42,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild(node_06,(TestNode *)this_42);
  this_43 = (MultisampleTextureFunctionalTestsBlittingMultisampledDepthAttachmentTest *)
            operator_new(0xa8);
  MultisampleTextureFunctionalTestsBlittingMultisampledDepthAttachmentTest::
  MultisampleTextureFunctionalTestsBlittingMultisampledDepthAttachmentTest
            (this_43,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild(node_06,(TestNode *)this_43);
  this_44 = (MultisampleTextureFunctionalTestsBlittingMultisampledIntegerAttachmentTest *)
            operator_new(0x98);
  MultisampleTextureFunctionalTestsBlittingMultisampledIntegerAttachmentTest::
  MultisampleTextureFunctionalTestsBlittingMultisampledIntegerAttachmentTest
            (this_44,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild(node_06,(TestNode *)this_44);
  this_45 = (MultisampleTextureFunctionalTestsBlittingToMultisampledFBOIsForbiddenTest *)
            operator_new(0x88);
  MultisampleTextureFunctionalTestsBlittingToMultisampledFBOIsForbiddenTest::
  MultisampleTextureFunctionalTestsBlittingToMultisampledFBOIsForbiddenTest
            (this_45,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild(node_06,(TestNode *)this_45);
  this_46 = (MultisampleTextureFunctionalTestsSampleMaskingForNonIntegerColorRenderableTexturesTest
             *)operator_new(0xa0);
  MultisampleTextureFunctionalTestsSampleMaskingForNonIntegerColorRenderableTexturesTest::
  MultisampleTextureFunctionalTestsSampleMaskingForNonIntegerColorRenderableTexturesTest
            (this_46,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild(node_06,(TestNode *)this_46);
  this_47 = (MultisampleTextureFunctionalTestsTextureSizeFragmentShadersTest *)operator_new(0x90);
  MultisampleTextureFunctionalTestsTextureSizeFragmentShadersTest::
  MultisampleTextureFunctionalTestsTextureSizeFragmentShadersTest
            (this_47,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild(node_06,(TestNode *)this_47);
  this_48 = (MultisampleTextureFunctionalTestsTextureSizeVertexShadersTest *)operator_new(0xa0);
  MultisampleTextureFunctionalTestsTextureSizeVertexShadersTest::
  MultisampleTextureFunctionalTestsTextureSizeVertexShadersTest
            (this_48,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild(node_06,(TestNode *)this_48);
  return extraout_EAX;
}

Assistant:

void TextureStorageMultisampleTests::init(void)
{
	/* Creating Tests Groups */
	tcu::TestCaseGroup* apiGLGetActiveUniformTestGroup =
		new tcu::TestCaseGroup(m_testCtx, "APIGLGetActiveUniform", "glGetActiveUniform()");
	tcu::TestCaseGroup* apiGLTexStorage2DMultisampleTestGroup =
		new tcu::TestCaseGroup(m_testCtx, "APIGLTexStorage2DMultisample", "glTexStorage2DMultisample()");
	tcu::TestCaseGroup* apiGLTexStorage3DMultisampleTestGroup =
		new tcu::TestCaseGroup(m_testCtx, "APIGLTexStorage3DMultisample", "glTexStorage3DMultisampleOES()");
	tcu::TestCaseGroup* apiGLGetMultisamplefvTestGroup =
		new tcu::TestCaseGroup(m_testCtx, "APIGLGetMultisamplefv", "glGetMultisamplefv()");
	tcu::TestCaseGroup* apiGLGetTexLevelParameterifvTestGroup =
		new tcu::TestCaseGroup(m_testCtx, "APIGLGetTexLevelParameterifv", "glGetTexLevelParameterifv()");
	tcu::TestCaseGroup* apiGLSampleMaskiTestGroup =
		new tcu::TestCaseGroup(m_testCtx, "APIGLSampleMaski", "glSampleMaski()");
	tcu::TestCaseGroup* apiDependenciesTestGroup =
		new tcu::TestCaseGroup(m_testCtx, "APIDependencies", "API Dependncies");
	tcu::TestCaseGroup* apiGLCoverageTestGroup = new tcu::TestCaseGroup(m_testCtx, "GLCoverage", "GL Coverage");
	tcu::TestCaseGroup* functionalTestGroup = new tcu::TestCaseGroup(m_testCtx, "FunctionalTests", "Functional Tests");

	/* Adding tests groups as children of this test suite */
	addChild(apiGLGetActiveUniformTestGroup);
	addChild(apiGLTexStorage2DMultisampleTestGroup);
	addChild(apiGLTexStorage3DMultisampleTestGroup);
	addChild(apiGLGetMultisamplefvTestGroup);
	addChild(apiGLGetTexLevelParameterifvTestGroup);
	addChild(apiGLSampleMaskiTestGroup);
	addChild(apiDependenciesTestGroup);
	addChild(apiGLCoverageTestGroup);
	addChild(functionalTestGroup);

	/* Assign tests to parent group: APIGLGetActiveUniform */
	apiGLGetActiveUniformTestGroup->addChild(new glcts::MultisampleTextureGetActiveUniformSamplersTest(m_context));

	/* Assign tests to parent group: APIGLTexStorage2DMultisample */
	apiGLTexStorage2DMultisampleTestGroup->addChild(
		new glcts::MultisampleTextureTexStorage2DGeneralSamplesNumberTest(m_context));
	apiGLTexStorage2DMultisampleTestGroup->addChild(
		new glcts::MultisampleTextureTexStorage2DInvalidAndBorderCaseTextureSizesTest(m_context));
	apiGLTexStorage2DMultisampleTestGroup->addChild(
		new glcts::MultisampleTextureTexStorage2DNonColorDepthOrStencilInternalFormatsTest(m_context));
	apiGLTexStorage2DMultisampleTestGroup->addChild(
		new glcts::MultisampleTextureTexStorage2DReconfigurationRejectedTest(m_context));
	apiGLTexStorage2DMultisampleTestGroup->addChild(
		new glcts::MultisampleTextureTexStorage2DTexture2DMultisampleArrayTest(m_context));
	apiGLTexStorage2DMultisampleTestGroup->addChild(
		new glcts::MultisampleTextureTexStorage2DUnsupportedSamplesCountForColorTexturesTest(m_context));
	apiGLTexStorage2DMultisampleTestGroup->addChild(
		new glcts::MultisampleTextureTexStorage2DUnsupportedSamplesCountForDepthTexturesTest(m_context));
	apiGLTexStorage2DMultisampleTestGroup->addChild(
		new glcts::MultisampleTextureTexStorage2DUnsupportedSamplesCountForDepthStencilTexturesTest(m_context));
	apiGLTexStorage2DMultisampleTestGroup->addChild(new glcts::MultisampleTextureTexStorage2DValidCallsTest(m_context));
	apiGLTexStorage2DMultisampleTestGroup->addChild(new glcts::MultisampleTextureTexStorage2DZeroSampleTest(m_context));

	/* Assign tests to parent group: APIGLTexStorage3DMultisample */
	apiGLTexStorage3DMultisampleTestGroup->addChild(
		new glcts::InvalidTextureSizesAreRejectedValidAreAcceptedTest(m_context));
	apiGLTexStorage3DMultisampleTestGroup->addChild(new glcts::MultisampleTextureTexStorage3DZeroSampleTest(m_context));
	apiGLTexStorage3DMultisampleTestGroup->addChild(
		new glcts::NonColorDepthStencilRenderableInternalformatsAreRejectedTest(m_context));
	apiGLTexStorage3DMultisampleTestGroup->addChild(
		new glcts::RequestsToSetUpMultisampleColorTexturesWithUnsupportedNumberOfSamplesAreRejectedTest(m_context));
	apiGLTexStorage3DMultisampleTestGroup->addChild(
		new glcts::RequestsToSetUpMultisampleDepthTexturesWithUnsupportedNumberOfSamplesAreRejectedTest(m_context));
	apiGLTexStorage3DMultisampleTestGroup->addChild(
		new glcts::RequestsToSetUpMultisampleStencilTexturesWithUnsupportedNumberOfSamplesAreRejectedTest(m_context));
	apiGLTexStorage3DMultisampleTestGroup->addChild(
		new glcts::RequestsToSetUpMultisampleTexturesWithValidAndInvalidNumberOfSamplesTest(m_context));
	apiGLTexStorage3DMultisampleTestGroup->addChild(new glcts::Texture2DMultisampleTargetIsRejectedTest(m_context));
	apiGLTexStorage3DMultisampleTestGroup->addChild(
		new glcts::ValidInternalformatAndSamplesValuesAreAcceptedTest(m_context));

	/* Assign tests to parent group: APIGLGetMultisamplefv */
	apiGLGetMultisamplefvTestGroup->addChild(
		new glcts::MultisampleTextureGetMultisamplefvIndexEqualGLSamplesRejectedTest(m_context));
	apiGLGetMultisamplefvTestGroup->addChild(
		new glcts::MultisampleTextureGetMultisamplefvIndexGreaterGLSamplesRejectedTest(m_context));
	apiGLGetMultisamplefvTestGroup->addChild(
		new glcts::MultisampleTextureGetMultisamplefvInvalidPnameRejectedTest(m_context));
	apiGLGetMultisamplefvTestGroup->addChild(
		new glcts::MultisampleTextureGetMultisamplefvNullValArgumentsAcceptedTest(m_context));
	apiGLGetMultisamplefvTestGroup->addChild(
		new glcts::MultisampleTextureGetMultisamplefvSamplePositionValuesValidationTest(m_context));

	/* Assign tests to parent group: APIGLGetTexLevelParameterifv */
	apiGLGetTexLevelParameterifvTestGroup->addChild(
		new glcts::MultisampleTextureGetTexLevelParametervFunctionalTest(m_context));
	apiGLGetTexLevelParameterifvTestGroup->addChild(
		new glcts::MultisampleTextureGetTexLevelParametervInvalidTextureTargetRejectedTest(m_context));
	apiGLGetTexLevelParameterifvTestGroup->addChild(
		new glcts::MultisampleTextureGetTexLevelParametervInvalidValueArgumentRejectedTest(m_context));
	apiGLGetTexLevelParameterifvTestGroup->addChild(
		new glcts::MultisampleTextureGetTexLevelParametervNegativeLodIsRejectedTest(m_context));
	apiGLGetTexLevelParameterifvTestGroup->addChild(
		new glcts::MultisampleTextureGetTexLevelParametervWorksForMaximumLodTest(m_context));

	/* Assign tests to parent group: APIGLSampleMaski */
	apiGLGetMultisamplefvTestGroup->addChild(new glcts::MultisampleTextureSampleMaskiGettersTest(m_context));
	apiGLGetMultisamplefvTestGroup->addChild(
		new glcts::MultisampleTextureSampleMaskiIndexLowerThanGLMaxSampleMaskWordsTest(m_context));
	apiGLGetMultisamplefvTestGroup->addChild(
		new glcts::MultisampleTextureSampleMaskiIndexEqualToGLMaxSampleMaskWordsTest(m_context));
	apiGLGetMultisamplefvTestGroup->addChild(
		new glcts::MultisampleTextureSampleMaskiIndexGreaterGLMaxSampleMaskWordsTest(m_context));

	/* Assign tests to parent group: APIDependencies */
	apiDependenciesTestGroup->addChild(new glcts::MultisampleTextureDependenciesFBOIncompleteness1Test(m_context));
	apiDependenciesTestGroup->addChild(new glcts::MultisampleTextureDependenciesFBOIncompleteness2Test(m_context));
	apiDependenciesTestGroup->addChild(new glcts::MultisampleTextureDependenciesFBOIncompleteness3Test(m_context));
	apiDependenciesTestGroup->addChild(new glcts::MultisampleTextureDependenciesFBOIncompleteness4Test(m_context));
	apiDependenciesTestGroup->addChild(new glcts::MultisampleTextureDependenciesFBOIncompleteness5Test(m_context));
	apiDependenciesTestGroup->addChild(
		new glcts::MultisampleTextureDependenciesInvalidFramebufferTexture2DCalls1Test(m_context));
	apiDependenciesTestGroup->addChild(
		new glcts::MultisampleTextureDependenciesInvalidFramebufferTexture2DCalls2Test(m_context));
	apiDependenciesTestGroup->addChild(
		new glcts::MultisampleTextureDependenciesInvalidFramebufferTextureLayerCalls1Test(m_context));
	apiDependenciesTestGroup->addChild(
		new glcts::MultisampleTextureDependenciesInvalidFramebufferTextureLayerCalls2Test(m_context));
	apiDependenciesTestGroup->addChild(
		new glcts::MultisampleTextureDependenciesInvalidRenderbufferStorageMultisampleCalls1Test(m_context));
	apiDependenciesTestGroup->addChild(
		new glcts::MultisampleTextureDependenciesInvalidRenderbufferStorageMultisampleCalls2Test(m_context));
	apiDependenciesTestGroup->addChild(
		new glcts::MultisampleTextureDependenciesNoErrorGeneratedForValidFramebufferTexture2DCallsTest(m_context));
	apiDependenciesTestGroup->addChild(
		new glcts::MultisampleTextureDependenciesNoErrorGeneratedForValidRenderbufferStorageMultisampleCallsTest(
			m_context));
	apiDependenciesTestGroup->addChild(new glcts::MultisampleTextureDependenciesTexParameterTest(m_context));

	/* Assign tests to parent group: GLCoverage */
	apiGLCoverageTestGroup->addChild(new glcts::GLCoverageExtensionSpecificEnumsAreRecognizedTest(m_context));
	apiGLCoverageTestGroup->addChild(
		new glcts::GLCoverageGLGetTexParameterReportsCorrectDefaultValuesForMultisampleTextureTargets(m_context));
	apiGLCoverageTestGroup->addChild(new glcts::GLCoverageGLSampleMaskModeStatusIsReportedCorrectlyTest(m_context));
	apiGLCoverageTestGroup->addChild(
		new glcts::GLCoverageGLTexParameterHandlersAcceptZeroBaseLevelForExtensionSpecificTextureTargetsTest(
			m_context));

	/* Assign tests to parent group: FunctionalTests */
	functionalTestGroup->addChild(new glcts::MultisampleTextureFunctionalTestsBlittingTest(m_context));
	functionalTestGroup->addChild(
		new glcts::MultisampleTextureFunctionalTestsBlittingMultisampledDepthAttachmentTest(m_context));
	functionalTestGroup->addChild(
		new glcts::MultisampleTextureFunctionalTestsBlittingMultisampledIntegerAttachmentTest(m_context));
	functionalTestGroup->addChild(
		new glcts::MultisampleTextureFunctionalTestsBlittingToMultisampledFBOIsForbiddenTest(m_context));
	functionalTestGroup->addChild(
		new glcts::MultisampleTextureFunctionalTestsSampleMaskingForNonIntegerColorRenderableTexturesTest(m_context));
	// TODO: temporarily disabled per request. Needs to be fixed.
	//functionalTestGroup->addChild(new glcts::MultisampleTextureFunctionalTestsSampleMaskingTexturesTest                            (m_context) );
	functionalTestGroup->addChild(
		new glcts::MultisampleTextureFunctionalTestsTextureSizeFragmentShadersTest(m_context));
	functionalTestGroup->addChild(new glcts::MultisampleTextureFunctionalTestsTextureSizeVertexShadersTest(m_context));
}